

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseVanillaLayer.cpp
# Opt level: O2

void __thiscall DenseVanillaLayer::DenseVanillaLayer(DenseVanillaLayer *this,LayerMeta *meta)

{
  undefined1 local_50 [64];
  
  LayerMeta::LayerMeta((LayerMeta *)local_50,meta);
  ILayer::ILayer(&this->super_ILayer,(LayerMeta *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  (this->super_ILayer)._vptr_ILayer = (_func_int **)&PTR__ILayer_00118c18;
  return;
}

Assistant:

DenseVanillaLayer::DenseVanillaLayer( LayerMeta meta ) : ILayer( std::move( meta )) { }